

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

bool __thiscall ON_CheckSum::Write(ON_CheckSum *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  int iVar2;
  uchar b [48];
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar2 < 4) {
    b[0x20] = '\0';
    b[0x21] = '\0';
    b[0x22] = '\0';
    b[0x23] = '\0';
    b[0x24] = '\0';
    b[0x25] = '\0';
    b[0x26] = '\0';
    b[0x27] = '\0';
    b[0x28] = '\0';
    b[0x29] = '\0';
    b[0x2a] = '\0';
    b[0x2b] = '\0';
    b[0x2c] = '\0';
    b[0x2d] = '\0';
    b[0x2e] = '\0';
    b[0x2f] = '\0';
    b[0x10] = '\0';
    b[0x11] = '\0';
    b[0x12] = '\0';
    b[0x13] = '\0';
    b[0x14] = '\0';
    b[0x15] = '\0';
    b[0x16] = '\0';
    b[0x17] = '\0';
    b[0x18] = '\0';
    b[0x19] = '\0';
    b[0x1a] = '\0';
    b[0x1b] = '\0';
    b[0x1c] = '\0';
    b[0x1d] = '\0';
    b[0x1e] = '\0';
    b[0x1f] = '\0';
    b[0] = '\0';
    b[1] = '\0';
    b[2] = '\0';
    b[3] = '\0';
    b[4] = '\0';
    b[5] = '\0';
    b[6] = '\0';
    b[7] = '\0';
    b[8] = '\0';
    b[9] = '\0';
    b[10] = '\0';
    b[0xb] = '\0';
    b[0xc] = '\0';
    b[0xd] = '\0';
    b[0xe] = '\0';
    b[0xf] = '\0';
    bVar1 = ON_BinaryArchive::WriteByte(archive,0x30,b);
  }
  else {
    bVar1 = ON_BinaryArchive::WriteBigSize(archive,this->m_size);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteBigTime(archive,this->m_time);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteInt(archive,8,this->m_crc);
        return bVar1;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_CheckSum::Write(ON_BinaryArchive& archive) const
{
  bool rc = false;
  if ( archive.Archive3dmVersion() < 4 )
  {
    // V3 files had other information
    // 48 bytes of zeros will work ok
    unsigned char b[48];
    memset(b,0,sizeof(b));
    rc = archive.WriteByte(48,b);
  }
  else
  {
    rc = archive.WriteBigSize(m_size);
    if (rc)
      rc = archive.WriteBigTime(m_time);
    if (rc)
      rc = archive.WriteInt(8,&m_crc[0]);
  }
  return rc;
}